

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O1

bool __thiscall
iutest::detail::
EachMatcher<iutest::detail::AnyOfMatcher<iutest::detail::GeMatcher<int>,iutest::detail::LeMatcher<int>>>
::Each<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (EachMatcher<iutest::detail::AnyOfMatcher<iutest::detail::GeMatcher<int>,iutest::detail::LeMatcher<int>>>
           *this,__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end)

{
  bool bVar1;
  type **in_R8;
  bool bVar2;
  AssertionResult local_80;
  AssertionResult local_58;
  
  bVar2 = begin._M_current == end._M_current;
  if (!bVar2) {
    do {
      AnyOfMatcherBase::
      Check_<std::tuple<iutest::detail::GeMatcher<int>,iutest::detail::LeMatcher<int>>,int,0,1>
                (&local_80,(AnyOfMatcherBase *)(this + 0x10),
                 (tuple<iutest::detail::GeMatcher<int>,_iutest::detail::LeMatcher<int>_> *)
                 begin._M_current,(int *)&iutest_type_traits::enabler_t<void>::value,in_R8);
      AssertionResult::operator!(&local_58,&local_80);
      bVar1 = local_58.m_result;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.m_message._M_dataplus._M_p != &local_58.m_message.field_2) {
        operator_delete(local_58.m_message._M_dataplus._M_p,
                        local_58.m_message.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
        operator_delete(local_80.m_message._M_dataplus._M_p,
                        local_80.m_message.field_2._M_allocated_capacity + 1);
      }
      if (bVar1 != false) {
        return bVar2;
      }
      begin._M_current =
           (int *)((long)&(((tuple<iutest::detail::GeMatcher<int>,_iutest::detail::LeMatcher<int>_>
                             *)begin._M_current)->
                          super__Tuple_impl<0UL,_iutest::detail::GeMatcher<int>,_iutest::detail::LeMatcher<int>_>
                          ).super__Tuple_impl<1UL,_iutest::detail::LeMatcher<int>_>.
                          super__Head_base<1UL,_iutest::detail::LeMatcher<int>,_false>._M_head_impl.
                          super_IMatcher._vptr_IMatcher + 4);
      bVar2 = begin._M_current == end._M_current;
    } while (!bVar2);
  }
  return bVar2;
}

Assistant:

::std::string WhichIs() const IUTEST_CXX_OVERRIDE
    {
        return ElementsAreMatcherBase::WhichIs<0>(m_matchers);
    }